

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

qint64 __thiscall
QHttpNetworkReplyPrivate::getChunkSize
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,qint64 *chunkSize)

{
  char *__s;
  size_t __n;
  int iVar1;
  CutResult CVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  int iVar6;
  char *b;
  char *pcVar7;
  long lVar8;
  undefined1 *puVar9;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  undefined1 auVar12 [12];
  char c;
  long local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *chunkSize = -1;
  iVar1 = (**(code **)(*(long *)socket + 0xa0))(socket);
  if ((long)iVar1 < 1) {
    lVar8 = 0;
  }
  else {
    local_3a = 0xaaaa;
    lVar8 = 0;
    do {
      lVar3 = QIODevice::peek((char *)socket,(longlong)&local_3a);
      lVar4 = (this->fragment).d.size;
      iVar6 = (int)lVar4;
      if (((((lVar3 == 2) && (iVar6 != 0)) && ((char)local_3a == '\r')) && (local_3a._1_1_ == '\n'))
         || ((1 < iVar6 && ((char)local_3a == '\n' && (this->fragment).d.ptr[lVar4 + -1] == '\r'))))
      {
        lVar4 = QIODevice::read((char *)socket,(longlong)&local_3a);
        lVar8 = lVar8 + lVar4;
        if ((char)local_3a == '\r') {
          lVar4 = QIODevice::read((char *)socket,(longlong)&local_3a);
          lVar8 = lVar8 + lVar4;
        }
        __s = (this->fragment).d.ptr;
        __n = (this->fragment).d.size;
        if ((__n == 0) || (pvVar5 = memchr(__s,0x3b,__n), pvVar5 == (void *)0x0)) {
          local_60 = -1;
        }
        else {
          local_60 = (long)pvVar5 - (long)__s;
        }
        local_58 = (undefined1 *)0x0;
        CVar2 = QtPrivate::QContainerImplHelper::mid(__n,(qsizetype *)&local_58,&local_60);
        pcVar7 = (char *)0x0;
        lVar4 = 0;
        if (CVar2 != Null) {
          pcVar7 = __s + (long)local_58;
          lVar4 = local_60;
        }
        QVar10.m_data = pcVar7;
        QVar10.m_size = lVar4;
        auVar12 = QtPrivate::trimmed(QVar10);
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        QVar11.m_data = auVar12._0_8_;
        QVar11.m_size = (qsizetype)&local_58;
        QtPrivate::toSignedInteger(QVar11,auVar12._8_4_);
        puVar9 = (undefined1 *)0x0;
        if (((ulong)puStack_50 & 1) == 0) {
          puVar9 = local_58;
        }
        *chunkSize = (qint64)puVar9;
        QByteArray::clear();
        break;
      }
      local_58 = (undefined1 *)((ulong)local_58 & 0xffffffffffffff00);
      lVar4 = QIODevice::read((char *)socket,(longlong)&local_58);
      if (lVar4 < 0) {
        lVar8 = -1;
        break;
      }
      lVar8 = lVar8 + lVar4;
      QByteArray::append((char)this + ' ');
    } while (lVar8 < iVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar8;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::getChunkSize(QIODevice *socket, qint64 *chunkSize)
{
    qint64 bytes = 0;
    char crlf[2];
    *chunkSize = -1;

    int bytesAvailable = socket->bytesAvailable();
    // FIXME rewrite to permanent loop without bytesAvailable
    while (bytesAvailable > bytes) {
        qint64 sniffedBytes = socket->peek(crlf, 2);
        int fragmentSize = fragment.size();

        // check the next two bytes for a "\r\n", skip blank lines
        if ((fragmentSize && sniffedBytes == 2 && crlf[0] == '\r' && crlf[1] == '\n')
           ||(fragmentSize > 1 && fragment.endsWith('\r')  && crlf[0] == '\n'))
        {
            bytes += socket->read(crlf, 1);     // read the \r or \n
            if (crlf[0] == '\r')
                bytes += socket->read(crlf, 1); // read the \n
            bool ok = false;
            // ignore the chunk-extension
            const auto fragmentView = QByteArrayView(fragment).mid(0, fragment.indexOf(';')).trimmed();
            *chunkSize = fragmentView.toLong(&ok, 16);
            fragment.clear();
            break; // size done
        } else {
            // read the fragment to the buffer
            char c = 0;
            qint64 haveRead = socket->read(&c, 1);
            if (haveRead < 0) {
                return -1; // FIXME
            }
            bytes += haveRead;
            fragment.append(c);
        }
    }

    return bytes;
}